

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

NULLCRef * NULLCVector::VectorNext(NULLCRef *__return_storage_ptr__,vector_iterator *iter)

{
  vector *pvVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = iter->arr->elemType;
  if (iter->arr->flags != 0) {
    uVar2 = nullcGetSubType(0);
  }
  __return_storage_ptr__->typeID = uVar2;
  pvVar1 = iter->arr;
  pcVar3 = (pvVar1->data).ptr;
  if (pvVar1->flags == 0) {
    pcVar3 = pcVar3 + iter->pos * pvVar1->elemSize;
  }
  else {
    pcVar3 = *(char **)(pcVar3 + (ulong)iter->pos * 8);
  }
  __return_storage_ptr__->ptr = pcVar3;
  iter->pos = iter->pos + 1;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorNext(vector_iterator* iter)
	{
		NULLCRef ret;
		ret.typeID = (iter->arr->flags ? nullcGetSubType(iter->arr->elemType) : iter->arr->elemType);
		ret.ptr =  iter->arr->flags ? ((char**)iter->arr->data.ptr)[iter->pos] : iter->arr->data.ptr + iter->arr->elemSize * iter->pos;
		iter->pos++;
		return ret;
	}